

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAcurv::ArchiveIN(ChNodeFEAcurv *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  undefined ***local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::fea::ChNodeFEAcurv>(marchive);
  ChNodeBase::ArchiveIN
            ((ChNodeBase *)
             ((long)(this->m_ryy).m_data +
             (long)((this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + -0x38)),marchive);
  local_38 = (ChVector<double> *)&(this->super_ChNodeFEAbase).field_0x20;
  local_58 = "m_rxx";
  local_48 = 0;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_ryy;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_ryy";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_rzz;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_rzz";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_rxx_dt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_rxx_dt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_ryy_dt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_ryy_dt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_rzz_dt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_rzz_dt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_rxx_dtdt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_rxx_dtdt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_ryy_dtdt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_ryy_dtdt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_rzz_dtdt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_rzz_dtdt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChNodeFEAcurv::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAcurv>();
    // deserialize parent class
    ChNodeFEAbase::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(m_rxx);
    marchive >> CHNVP(m_ryy);
    marchive >> CHNVP(m_rzz);
    marchive >> CHNVP(m_rxx_dt);
    marchive >> CHNVP(m_ryy_dt);
    marchive >> CHNVP(m_rzz_dt);
    marchive >> CHNVP(m_rxx_dtdt);
    marchive >> CHNVP(m_ryy_dtdt);
    marchive >> CHNVP(m_rzz_dtdt);
}